

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

int SSL_ECH_KEYS_has_duplicate_config_id(SSL_ECH_KEYS *keys)

{
  Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_> *this;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *puVar1;
  pointer pEVar2;
  ECHConfig *pEVar3;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *config;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *__end1;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *__begin1;
  Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_> *__range1;
  bool seen [256];
  SSL_ECH_KEYS *keys_local;
  
  seen._248_8_ = keys;
  memset(&__range1,0,0x100);
  this = (Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_> *)
         (seen._248_8_ + 8);
  __end1 = bssl::Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_>::begin
                     (this);
  puVar1 = bssl::Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_>::end(this)
  ;
  while( true ) {
    if (__end1 == puVar1) {
      return 0;
    }
    pEVar2 = std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>::operator->(__end1);
    pEVar3 = bssl::ECHServerConfig::ech_config(pEVar2);
    if ((seen[(ulong)pEVar3->config_id - 8] & 1U) != 0) break;
    pEVar2 = std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>::operator->(__end1);
    pEVar3 = bssl::ECHServerConfig::ech_config(pEVar2);
    seen[(ulong)pEVar3->config_id - 8] = true;
    __end1 = __end1 + 1;
  }
  return 1;
}

Assistant:

int SSL_ECH_KEYS_has_duplicate_config_id(const SSL_ECH_KEYS *keys) {
  bool seen[256] = {false};
  for (const auto &config : keys->configs) {
    if (seen[config->ech_config().config_id]) {
      return 1;
    }
    seen[config->ech_config().config_id] = true;
  }
  return 0;
}